

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_map.cpp
# Opt level: O2

unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
 __thiscall
duckdb::BoundParameterMap::BindParameterExpression
          (BoundParameterMap *this,ParameterExpression *expr)

{
  bool bVar1;
  pointer pBVar2;
  BoundParameterData *pBVar3;
  long in_RDX;
  shared_ptr<duckdb::BoundParameterData,_true> param_data;
  LogicalType local_88;
  LogicalType local_70;
  LogicalType identifier_type;
  LogicalType param_type;
  
  CreateOrGetData((BoundParameterMap *)&param_data,(string *)expr);
  make_uniq<duckdb::BoundParameterExpression,std::__cxx11::string&>
            ((duckdb *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 0x38));
  pBVar2 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)this);
  shared_ptr<duckdb::BoundParameterData,_true>::operator=(&pBVar2->parameter_data,&param_data);
  pBVar2 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)this);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pBVar2->super_Expression).super_BaseExpression.alias);
  pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&param_data);
  LogicalType::LogicalType(&param_type,&pBVar3->return_type);
  GetReturnType(&identifier_type,(BoundParameterMap *)expr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 0x38)
               );
  LogicalType::LogicalType(&local_88,UNKNOWN);
  bVar1 = LogicalType::operator==(&identifier_type,&local_88);
  if (bVar1) {
    LogicalType::LogicalType(&local_70,UNKNOWN);
    bVar1 = LogicalType::operator!=(&param_type,&local_70);
    LogicalType::~LogicalType(&local_70);
    LogicalType::~LogicalType(&local_88);
    if (bVar1) {
      *(undefined1 *)&(expr->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = 1;
    }
  }
  else {
    LogicalType::~LogicalType(&local_88);
  }
  pBVar2 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)this);
  LogicalType::operator=(&(pBVar2->super_Expression).return_type,&identifier_type);
  LogicalType::~LogicalType(&identifier_type);
  LogicalType::~LogicalType(&param_type);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&param_data.internal.
              super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return (unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
          )(unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
            )this;
}

Assistant:

unique_ptr<BoundParameterExpression> BoundParameterMap::BindParameterExpression(ParameterExpression &expr) {

	auto &identifier = expr.identifier;
	D_ASSERT(!parameter_data.count(identifier));

	// No value has been supplied yet,
	// We return a shared pointer to an object that will get populated with a Value later
	// When the BoundParameterExpression gets executed, this will be used to get the corresponding value
	auto param_data = CreateOrGetData(identifier);
	auto bound_expr = make_uniq<BoundParameterExpression>(identifier);

	bound_expr->parameter_data = param_data;
	bound_expr->SetAlias(expr.GetAlias());

	auto param_type = param_data->return_type;
	auto identifier_type = GetReturnType(identifier);

	// we found a type for this bound parameter, but now we found another occurrence with the same identifier,
	// a CAST around this consecutive occurrence might swallow the unknown type of this consecutive occurrence,
	// then, if we do not rebind, we potentially have unknown data types during execution
	if (identifier_type == LogicalType::UNKNOWN && param_type != LogicalType::UNKNOWN) {
		rebind = true;
	}

	bound_expr->return_type = identifier_type;
	return bound_expr;
}